

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

PolynomialType * __thiscall
OpenMD::Polynomial<double>::operator*=(Polynomial<double> *this,double v)

{
  bool bVar1;
  pointer ppVar2;
  PolynomialType *in_RDI;
  double in_XMM0_Qa;
  const_iterator i;
  Polynomial<double> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar3;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_20;
  _Rb_tree_const_iterator<std::pair<const_int,_double>_> local_18;
  double local_10;
  
  local_10 = in_XMM0_Qa;
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator(&local_18);
  local_28._M_node = (_Base_ptr)begin(in_stack_ffffffffffffffa8);
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator
            (&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    local_38._M_node = (_Base_ptr)end(in_stack_ffffffffffffffa8);
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator
              (&local_30,&local_38);
    bVar1 = std::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x309508);
    iVar3 = ppVar2->first;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x309518);
    setCoefficient((Polynomial<double> *)(ppVar2->second * local_10),(int)((ulong)in_RDI >> 0x20),
                   (double *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)
               CONCAT44(iVar3,in_stack_ffffffffffffffb0));
  }
  return in_RDI;
}

Assistant:

PolynomialType& operator*=(const Real v) {
      typename Polynomial<Real>::const_iterator i;
      // Polynomial<Real> result;

      for (i = this->begin(); i != this->end(); ++i) {
        this->setCoefficient(i->first, i->second * v);
      }

      return *this;
    }